

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O2

bool __thiscall
absl::lts_20250127::str_format_internal::anon_unknown_53::ConvertStringArg
          (anon_unknown_53 *this,wchar_t *v,size_t len,FormatConversionSpecImpl conv,
          FormatSinkImpl *sink)

{
  wchar_t wc;
  bool bVar1;
  reference buf;
  size_t sVar2;
  size_type i_00;
  size_t i;
  wchar_t *pwVar3;
  string_view v_00;
  FormatConversionSpecImpl conv_00;
  ShiftState s;
  FixedArray<char,_18446744073709551615UL,_std::allocator<char>_> mb;
  ShiftState local_152;
  size_t local_150;
  FormatSinkImpl *local_148;
  Storage local_140;
  
  local_148 = (FormatSinkImpl *)CONCAT44((int)((ulong)register0x00000080 >> 0x20),conv.precision_);
  conv_00.precision_ = conv._0_4_;
  local_140.size_alloc_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<unsigned_long,_std::allocator<char>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
  .super_Storage<unsigned_long,_0UL,_false>.value =
       (CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<unsigned_long,_std::allocator<char>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
        )((long)v * 4);
  local_150 = len;
  local_140.data_ =
       FixedArray<char,_18446744073709551615UL,_std::allocator<char>_>::Storage::InitializeData
                 (&local_140);
  local_152.saw_high_surrogate = false;
  local_152.bits = '\0';
  pwVar3 = (wchar_t *)0x0;
  i_00 = 0;
  do {
    if (v == pwVar3) {
      v_00._M_str = local_140.data_;
      v_00._M_len = i_00;
      conv_00.conv_ = (undefined1)local_150;
      conv_00.flags_ = local_150._1_1_;
      conv_00.length_mod_ = local_150._2_1_;
      conv_00._3_1_ = local_150._3_1_;
      conv_00.width_ = local_150._4_4_;
      bVar1 = ConvertStringArg(v_00,conv_00,local_148);
LAB_00d0ea3b:
      FixedArray<char,_18446744073709551615UL,_std::allocator<char>_>::Storage::~Storage(&local_140)
      ;
      return bVar1;
    }
    wc = *(wchar_t *)(this + (long)pwVar3 * 4);
    buf = FixedArray<char,_18446744073709551615UL,_std::allocator<char>_>::operator[]
                    ((FixedArray<char,_18446744073709551615UL,_std::allocator<char>_> *)&local_140,
                     i_00);
    sVar2 = WideToUtf8(wc,buf,&local_152);
    if (sVar2 == 0xffffffffffffffff) {
      bVar1 = false;
      goto LAB_00d0ea3b;
    }
    i_00 = i_00 + sVar2;
    pwVar3 = (wchar_t *)((long)pwVar3 + 1);
  } while( true );
}

Assistant:

inline bool ConvertStringArg(const wchar_t *v,
                             size_t len,
                             const FormatConversionSpecImpl conv,
                             FormatSinkImpl *sink) {
  FixedArray<char> mb(len * 4);
  ShiftState s;
  size_t chars_written = 0;
  for (size_t i = 0; i < len; ++i) {
    const size_t chars = WideToUtf8(v[i], &mb[chars_written], s);
    if (chars == static_cast<size_t>(-1)) { return false; }
    chars_written += chars;
  }
  return ConvertStringArg(string_view(mb.data(), chars_written), conv, sink);
}